

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::variableCheck(HlslParseContext *this,TIntermTyped **nodePtr)

{
  TIntermediate *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t s;
  undefined4 extraout_var_02;
  char *pcVar2;
  undefined4 extraout_var_03;
  size_type sVar3;
  TVariable *pTVar4;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TIntermSymbol *pTVar5;
  TType local_c0;
  TVariable *local_28;
  TVariable *fakeVariable;
  TIntermSymbol *symbol;
  TIntermTyped **nodePtr_local;
  HlslParseContext *this_local;
  undefined4 extraout_var_01;
  
  symbol = (TIntermSymbol *)nodePtr;
  nodePtr_local = (TIntermTyped **)this;
  iVar1 = (*((*nodePtr)->super_TIntermNode)._vptr_TIntermNode[0xc])();
  fakeVariable = (TVariable *)CONCAT44(extraout_var,iVar1);
  if (fakeVariable != (TVariable *)0x0) {
    iVar1 = (*(fakeVariable->super_TSymbol)._vptr_TSymbol[0x1e])();
    iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x38))();
    if (iVar1 == 0) {
      iVar1 = (**(fakeVariable->super_TSymbol)._vptr_TSymbol)();
      s = CONCAT44(extraout_var_01,iVar1);
      iVar1 = (*(fakeVariable->super_TSymbol)._vptr_TSymbol[0x32])();
      pcVar2 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_02,iVar1));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,s,"undeclared identifier",pcVar2,"");
      iVar1 = (*(fakeVariable->super_TSymbol)._vptr_TSymbol[0x32])();
      sVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_03,iVar1));
      if (sVar3 != 0) {
        pTVar4 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,s);
        iVar1 = (*(fakeVariable->super_TSymbol)._vptr_TSymbol[0x32])();
        TType::TType(&local_c0,EbtFloat,EvqTemporary,1,0,0,false);
        TVariable::TVariable(pTVar4,(TString *)CONCAT44(extraout_var_04,iVar1),&local_c0,false);
        TType::~TType(&local_c0);
        local_28 = pTVar4;
        TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar4);
        pTVar4 = local_28;
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar1 = (**(fakeVariable->super_TSymbol)._vptr_TSymbol)();
        pTVar5 = TIntermediate::addSymbol
                           (this_00,pTVar4,(TSourceLoc *)CONCAT44(extraout_var_05,iVar1));
        (symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode = (_func_int **)pTVar5;
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::variableCheck(TIntermTyped*& nodePtr)
{
    TIntermSymbol* symbol = nodePtr->getAsSymbolNode();
    if (! symbol)
        return;

    if (symbol->getType().getBasicType() == EbtVoid) {
        error(symbol->getLoc(), "undeclared identifier", symbol->getName().c_str(), "");

        // Add to symbol table to prevent future error messages on the same name
        if (symbol->getName().size() > 0) {
            TVariable* fakeVariable = new TVariable(&symbol->getName(), TType(EbtFloat));
            symbolTable.insert(*fakeVariable);

            // substitute a symbol node for this new variable
            nodePtr = intermediate.addSymbol(*fakeVariable, symbol->getLoc());
        }
    }
}